

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O2

Config * __thiscall QPDFJob::Config::emptyInput(Config *this)

{
  allocator<char> local_39;
  string local_38;
  __shared_ptr<char,_(__gnu_cxx::_Lock_policy)2> local_18;
  
  if ((((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0
     ) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
    QUtil::make_shared_cstr((QUtil *)&local_18,&local_38);
    std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>,&local_18
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18._M_refcount);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,
               "empty input can\'t be used since input file has already been given",
               (allocator<char> *)&local_18);
    usage(&local_38);
  }
  std::__cxx11::string::~string((string *)&local_38);
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::emptyInput()
{
    if (o.m->infilename == nullptr) {
        // Various places in QPDFJob.cc know that the empty string for infile means empty. We set it
        // to something other than a null pointer as an indication that some input source has been
        // specified. This approach means that passing "" as the argument to inputFile in job JSON,
        // or equivalently using "" as a positional command-line argument would be the same as
        // --empty. This probably isn't worth blocking or coding around.
        o.m->infilename = QUtil::make_shared_cstr("");
    } else {
        usage("empty input can't be used since input file has already been given");
    }
    return this;
}